

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int dom_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  byte bVar1;
  bitmap_el_t *pbVar2;
  bitmap_t pVVar3;
  bitmap_t pVVar4;
  bitmap_el_t *pbVar5;
  MIR_context_t ctx;
  int iVar6;
  int iVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 extraout_RAX;
  bitmap_t pVVar8;
  char *pcVar9;
  bb_t_conflict extraout_RDX;
  bb_t_conflict extraout_RDX_00;
  char *pcVar10;
  bitmap_t pVVar11;
  bitmap_t pVVar12;
  bitmap_t bm;
  ulong unaff_RBP;
  bitmap_t pVVar13;
  const_bitmap_t src;
  const_bitmap_t nb;
  const_bitmap_t nb_00;
  char *pcVar14;
  bitmap_t pVVar15;
  bitmap_el_t bVar16;
  ulong uVar17;
  size_t sVar18;
  size_t sVar19;
  bb_t_conflict pbVar20;
  ulong unaff_R12;
  ulong unaff_R13;
  ulong uVar21;
  in_edge_t_conflict peVar22;
  ulong uVar23;
  undefined8 uVar24;
  bb_t_conflict pbVar25;
  const_bitmap_t pVVar26;
  
  pVVar12 = gen_ctx->temp_bitmap;
  bitmap_copy(pVVar12,bb->dom_in);
  peVar22 = (bb->in_edges).head;
  pVVar8 = bb->dom_in;
  src = peVar22->src->dom_out;
  bitmap_copy(pVVar8,src);
  while (peVar22 = (peVar22->in_link).next, peVar22 != (in_edge_t)0x0) {
    src = bb->dom_in;
    pVVar8 = src;
    bitmap_and(src,src,peVar22->src->dom_out);
  }
  pVVar11 = bb->dom_in;
  if (pVVar11 == (bitmap_t)0x0) {
    dom_con_func_n_cold_2();
  }
  else if (pVVar12 != (bitmap_t)0x0) {
    uVar23 = pVVar11->els_num;
    uVar17 = pVVar12->els_num;
    pVVar8 = pVVar12;
    uVar21 = uVar17;
    if (uVar17 < uVar23) {
      pVVar8 = pVVar11;
      pVVar11 = pVVar12;
      uVar21 = uVar23;
      uVar23 = uVar17;
    }
    pbVar2 = pVVar8->varr;
    iVar6 = bcmp(pVVar11->varr,pbVar2,uVar23 * 8);
    iVar7 = 1;
    if (iVar6 == 0) {
      if (uVar23 < uVar21) {
        do {
          if (pbVar2[uVar23] != 0) {
            return 1;
          }
          uVar23 = uVar23 + 1;
        } while (uVar21 != uVar23);
      }
      iVar7 = 0;
    }
    return iVar7;
  }
  dom_con_func_n_cold_1();
  pVVar11 = (bitmap_t)pVVar8[3].size;
  if ((pVVar11 != (bitmap_t)0x0) && (pVVar11->varr != (bitmap_el_t *)0x0)) {
    pVVar11->els_num = 0;
    uVar23 = src->els_num;
    bitmap_expand(pVVar11,uVar23 + 1);
    pVVar11->varr[uVar23 >> 6] = pVVar11->varr[uVar23 >> 6] | 1L << (uVar23 & 0x3f);
    iVar6 = bitmap_ior((bitmap_t)src[6].els_num,(bitmap_t)src[5].varr,(bitmap_t)pVVar8[3].size);
    return iVar6;
  }
  dom_trans_func_cold_1();
  if (src == (const_bitmap_t)0x0) {
    bitmap_ior_cold_4();
    nb = src;
    bm = pVVar8;
LAB_00166050:
    bitmap_ior_cold_3();
LAB_00166055:
    bitmap_ior_cold_2();
    pVVar8 = pVVar12;
    src = pVVar11;
  }
  else {
    nb = src;
    bm = pVVar8;
    bb = extraout_RDX;
    if (extraout_RDX == (bb_t_conflict)0x0) goto LAB_00166050;
    unaff_R13 = extraout_RDX->index;
    unaff_R12 = src->els_num;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb = (const_bitmap_t)(unaff_RBP << 6);
    bitmap_expand(pVVar8,(size_t)nb);
    pVVar12 = pVVar8;
    pVVar11 = src;
    if (pVVar8 == (bitmap_t)0x0) goto LAB_00166055;
    pbVar2 = pVVar8->varr;
    if (unaff_RBP == 0) {
      if (pbVar2 != (bitmap_el_t *)0x0) {
        uVar23 = 0;
        iVar6 = 0;
        goto LAB_00166039;
      }
    }
    else {
      nb = (const_bitmap_t)src->varr;
      bm = (bitmap_t)extraout_RDX->rpost;
      iVar6 = 0;
      uVar23 = 0;
      uVar17 = 0;
      do {
        if (uVar17 < unaff_R12) {
          sVar18 = (&nb->els_num)[uVar17];
        }
        else {
          sVar18 = 0;
        }
        if (uVar17 < unaff_R13) {
          sVar19 = (&bm->els_num)[uVar17];
        }
        else {
          sVar19 = 0;
        }
        bb = (bb_t_conflict)pbVar2[uVar17];
        pbVar20 = (bb_t_conflict)(sVar19 | sVar18);
        uVar21 = uVar17 + 1;
        if (pbVar20 != (bb_t_conflict)0x0) {
          uVar23 = uVar21;
        }
        pbVar2[uVar17] = (bitmap_el_t)pbVar20;
        if (bb != pbVar20) {
          iVar6 = 1;
        }
        uVar17 = uVar21;
      } while (unaff_RBP != uVar21);
      if (uVar23 <= pVVar8->els_num) {
LAB_00166039:
        pVVar8->els_num = uVar23;
        return iVar6;
      }
    }
  }
  bitmap_ior_cold_1();
  uVar24 = extraout_RAX;
  pVVar12 = pVVar8;
  pVVar26 = src;
  if (nb == (const_bitmap_t)0x0) {
    pbVar25 = bb;
    bitmap_and_compl_cold_4();
    nb_00 = nb;
    pVVar11 = bm;
    pbVar20 = bb;
    bb = pbVar25;
LAB_00166118:
    bitmap_and_compl_cold_3();
  }
  else {
    nb_00 = nb;
    pVVar11 = bm;
    pbVar20 = extraout_RDX_00;
    if (extraout_RDX_00 == (bb_t_conflict)0x0) goto LAB_00166118;
    pVVar3 = (bitmap_t)extraout_RDX_00->index;
    pVVar4 = (bitmap_t)nb->els_num;
    pVVar13 = pVVar3;
    if (pVVar3 < pVVar4) {
      pVVar13 = pVVar4;
    }
    nb_00 = (const_bitmap_t)((long)pVVar13 << 6);
    bitmap_expand(bm,(size_t)nb_00);
    pVVar8 = bm;
    pbVar20 = extraout_RDX_00;
    src = nb;
    if (bm != (bitmap_t)0x0) {
      pbVar2 = bm->varr;
      if (pVVar13 == (bitmap_t)0x0) {
        if (pbVar2 != (bitmap_el_t *)0x0) {
          pVVar8 = (bitmap_t)0x0;
          goto LAB_00166101;
        }
      }
      else {
        pbVar5 = nb->varr;
        nb_00 = (const_bitmap_t)extraout_RDX_00->rpost;
        pVVar8 = (bitmap_t)0x0;
        pVVar15 = (bitmap_t)0x0;
        do {
          if (pVVar15 < pVVar4) {
            bVar16 = pbVar5[(long)pVVar15];
          }
          else {
            bVar16 = 0;
          }
          uVar23 = 0xffffffffffffffff;
          if (pVVar15 < pVVar3) {
            uVar23 = ~(&nb_00->els_num)[(long)pVVar15];
          }
          pVVar11 = (bitmap_t)((long)&pVVar15->els_num + 1);
          if ((uVar23 & bVar16) != 0) {
            pVVar8 = pVVar11;
          }
          pbVar2[(long)pVVar15] = uVar23 & bVar16;
          pVVar15 = pVVar11;
        } while (pVVar13 != pVVar11);
        if (pVVar8 <= (bitmap_t)bm->els_num) {
LAB_00166101:
          bm->els_num = (size_t)pVVar8;
          return (int)pbVar2;
        }
      }
      goto LAB_00166122;
    }
  }
  bitmap_and_compl_cold_2();
  bm = pVVar8;
  nb = src;
LAB_00166122:
  bitmap_and_compl_cold_1();
  if (((FILE *)pVVar11[1].els_num != (FILE *)0x0) && (1 < (int)pVVar11[1].size)) {
    bVar1 = *(byte *)((long)&nb_00->size + 1);
    pcVar14 = "may/must alloca ";
    ctx = (MIR_context_t)pVVar11->els_num;
    if ((bVar1 & 3) == 0) {
      pcVar14 = "must alloca";
    }
    pcVar9 = "const val";
    pcVar10 = "";
    if (bVar1 != 0) {
      pcVar10 = pcVar14;
    }
    if ((char)nb_00->size == '\0') {
      pcVar9 = "val";
    }
    fprintf((FILE *)pVVar11[1].els_num,"%s%s=%lld for insn %lu:",pcVar10,pcVar9,nb_00[1].els_num,
            (ulong)*(uint *)((long)&nb_00->size + 4),bm,pbVar20,nb,uVar24,pVVar12,unaff_R12,
            unaff_R13,bb,pVVar26,unaff_RBP);
    MIR_output_insn(ctx,(FILE *)pVVar11[1].els_num,(MIR_insn_t_conflict)nb_00->els_num,
                    (MIR_func_t)pVVar11->varr[8],1);
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

static int dom_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, head;
  bitmap_t prev_dom_in = temp_bitmap;

  bitmap_copy (prev_dom_in, bb->dom_in);
  head = DLIST_HEAD (in_edge_t, bb->in_edges);
  bitmap_copy (bb->dom_in, head->src->dom_out);
  for (e = DLIST_NEXT (in_edge_t, head); e != NULL; e = DLIST_NEXT (in_edge_t, e))
    bitmap_and (bb->dom_in, bb->dom_in, e->src->dom_out); /* dom_in &= dom_out */
  return !bitmap_equal_p (bb->dom_in, prev_dom_in);
}